

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void __thiscall tinyxml2::XMLAttribute::~XMLAttribute(XMLAttribute *this)

{
  char *pcVar1;
  
  this->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00272ae0;
  if ((((this->_value)._flags & 0x200) != 0) &&
     (pcVar1 = (this->_value)._start, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
  }
  (this->_value)._flags = 0;
  (this->_value)._start = (char *)0x0;
  (this->_value)._end = (char *)0x0;
  if ((((this->_name)._flags & 0x200) != 0) &&
     (pcVar1 = (this->_name)._start, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
  }
  (this->_name)._flags = 0;
  (this->_name)._start = (char *)0x0;
  (this->_name)._end = (char *)0x0;
  return;
}

Assistant:

virtual ~XMLAttribute()	{}